

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_get_until_first(CBS *cbs,CBS *out,uint8_t c)

{
  uint8_t *puVar1;
  size_t n;
  void *pvVar2;
  uint8_t *split;
  uint8_t c_local;
  CBS *out_local;
  CBS *cbs_local;
  
  puVar1 = CBS_data(cbs);
  n = CBS_len(cbs);
  pvVar2 = OPENSSL_memchr(puVar1,(uint)c,n);
  if (pvVar2 == (void *)0x0) {
    cbs_local._4_4_ = 0;
  }
  else {
    puVar1 = CBS_data(cbs);
    cbs_local._4_4_ = CBS_get_bytes(cbs,out,(long)pvVar2 - (long)puVar1);
  }
  return cbs_local._4_4_;
}

Assistant:

int CBS_get_until_first(CBS *cbs, CBS *out, uint8_t c) {
  const uint8_t *split = reinterpret_cast<const uint8_t *>(
      OPENSSL_memchr(CBS_data(cbs), c, CBS_len(cbs)));
  if (split == NULL) {
    return 0;
  }
  return CBS_get_bytes(cbs, out, split - CBS_data(cbs));
}